

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

FLOAT __thiscall Matrix::mean(Matrix *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int32_t j;
  ulong uVar6;
  double dVar7;
  
  uVar1 = this->m;
  uVar2 = this->n;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  dVar7 = 0.0;
  for (; uVar3 != uVar5; uVar3 = uVar3 + 1) {
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      dVar7 = dVar7 + this->val[uVar3][uVar6];
    }
  }
  return dVar7 / (double)(int)(uVar2 * uVar1);
}

Assistant:

FLOAT Matrix::mean () {
  FLOAT mean = 0;
  for (int32_t i=0; i<m; i++)
    for (int32_t j=0; j<n; j++)
      mean += val[i][j];
  return mean/(FLOAT)(m*n);
}